

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O1

int __thiscall crnlib::dynamic_string::find_right(dynamic_string *this,char *p,bool case_sensitive)

{
  int iVar1;
  size_t sVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  code *pcVar6;
  
  sVar2 = strlen(p);
  if ((int)CONCAT71(in_register_00000011,case_sensitive) == 0) {
    pcVar6 = strncasecmp;
  }
  else {
    pcVar6 = strncmp;
  }
  uVar4 = (uint)this->m_len - (int)sVar2;
  if (-1 < (int)uVar4) {
    uVar3 = (ulong)uVar4;
    iVar5 = uVar4 + 1;
    do {
      iVar1 = (*pcVar6)(p,this->m_pStr + uVar3,(long)(int)sVar2);
      if (iVar1 == 0) {
        return (int)uVar3;
      }
      uVar3 = uVar3 - 1;
      iVar5 = iVar5 + -1;
    } while (0 < iVar5);
  }
  return -1;
}

Assistant:

int dynamic_string::find_right(const char* p, bool case_sensitive) const
    {
        CRNLIB_ASSERT(p);
        const int p_len = (int)strlen(p);

        for (int i = m_len - p_len; i >= 0; i--)
        {
            if ((case_sensitive ? strncmp : _strnicmp)(p, &m_pStr[i], p_len) == 0)
            {
                return i;
            }
        }

        return -1;
    }